

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FieldDescriptorProto::_InternalParse
          (FieldDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  FieldOptions *pFVar4;
  char cVar5;
  uint32 uVar6;
  uint tag;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  Arena *pAVar7;
  char cVar8;
  ArenaStringPtr *this_00;
  uint uVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_bool> pVar13;
  
  uVar9 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar13._8_8_ = 0;
      pVar13.first = ptr;
    }
    else {
      pVar13._8_8_ = 1;
      pVar13.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar13 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar13.first;
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002f8e2c;
    bVar2 = *ptr;
    pVar10.second._0_1_ = bVar2;
    pVar10.first = (char *)((byte *)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar2 < '\0') {
      bVar3 = ((byte *)ptr)[1];
      uVar6 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
      if ((char)bVar3 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,uVar6);
      }
      else {
        pVar10.second = uVar6;
        pVar10.first = (char *)((byte *)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    ptr = pVar10.first;
    cVar8 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar10.second;
      cVar5 = (char)pVar10.second;
      switch((uint)(pVar10._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar5 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        this_00 = &this->name_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
LAB_002f8bf5:
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        goto LAB_002f8c20;
      case 2:
        if (cVar5 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          this_00 = &this->extendee_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002f8bf5;
        }
        break;
      case 3:
        if (cVar5 == '\x18') {
          bVar2 = *ptr;
          pVar12.second = (long)(char)bVar2;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar12.second._0_4_ = uVar6;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 0x40;
          this->number_ = (int32)pVar12.second;
LAB_002f8d63:
          ptr = pVar12.first;
          cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_002f8d76;
        }
        break;
      case 4:
        if (cVar5 == ' ') {
          bVar2 = *ptr;
          pVar11.second = (long)(char)bVar2;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar11.second._0_4_ = uVar6;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          ptr = pVar11.first;
          if ((byte *)ptr != (byte *)0x0) {
            if ((int)pVar11.second - 1U < 3) {
              pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
              *pbVar1 = *pbVar1 | 1;
              this->label_ = (int)pVar11.second;
            }
            else {
              _InternalParse();
              pVar11.second = extraout_RDX_00;
              pVar11.first = ptr;
            }
LAB_002f8d1e:
            ptr = pVar11.first;
            cVar8 = '\x02';
          }
          goto LAB_002f8d76;
        }
        break;
      case 5:
        if (cVar5 == '(') {
          bVar2 = *ptr;
          pVar11.second = (long)(char)bVar2;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar11.second._0_4_ = uVar6;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          ptr = pVar11.first;
          if ((byte *)ptr != (byte *)0x0) {
            if ((int)pVar11.second - 1U < 0x12) {
              pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
              *pbVar1 = *pbVar1 | 2;
              this->type_ = (int)pVar11.second;
            }
            else {
              _InternalParse();
              pVar11.second = extraout_RDX;
              pVar11.first = ptr;
            }
            goto LAB_002f8d1e;
          }
          goto LAB_002f8d76;
        }
        break;
      case 6:
        if (cVar5 == '2') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          this_00 = &this->type_name_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002f8bf5;
        }
        break;
      case 7:
        if (cVar5 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          this_00 = &this->default_value_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002f8bf5;
        }
        break;
      case 8:
        if (cVar5 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
          if (this->options_ == (FieldOptions *)0x0) {
            pAVar7 = (Arena *)(this->_internal_metadata_).
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              .ptr_;
            if (((ulong)pAVar7 & 1) != 0) {
              pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
            }
            pFVar4 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar7);
            this->options_ = pFVar4;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldOptions>
                          (ctx,this->options_,ptr);
          goto LAB_002f8c20;
        }
        break;
      case 9:
        if (cVar5 == 'H') {
          bVar2 = *ptr;
          pVar12.second = (long)(char)bVar2;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar12.second._0_4_ = uVar6;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 0x80;
          this->oneof_index_ = (int32)pVar12.second;
          goto LAB_002f8d63;
        }
        break;
      case 10:
        if (cVar5 == 'R') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          this_00 = &this->json_name_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002f8bf5;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar8 = '\a';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
LAB_002f8c20:
        cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002f8d76:
  } while (cVar8 == '\x02');
  if (cVar8 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002f8e2c:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)(byte *)ptr;
}

Assistant:

const char* FieldDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string extendee = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_extendee(), ptr, ctx, "google.protobuf.FieldDescriptorProto.extendee");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(val))) {
            _internal_set_label(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(4, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(val))) {
            _internal_set_type(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional string type_name = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_type_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.type_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string default_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_default_value(), ptr, ctx, "google.protobuf.FieldDescriptorProto.default_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 oneof_index = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          _Internal::set_has_oneof_index(&has_bits);
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_json_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.json_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}